

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printTry(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  emit(this,"try ");
  pRVar1 = Ref::operator[](&local_20,1);
  printBlock(this,pRVar1->inst);
  emit(this," catch (");
  pRVar1 = Ref::operator[](&local_20,2);
  printName(this,pRVar1->inst);
  emit(this,") ");
  pRVar1 = Ref::operator[](&local_20,3);
  printBlock(this,pRVar1->inst);
  return;
}

Assistant:

void printTry(Ref node) {
    emit("try ");
    printBlock(node[1]);
    emit(" catch (");
    printName(node[2]);
    emit(") ");
    printBlock(node[3]);
  }